

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O0

MPP_RET jpege_start(void *ctx,HalEncTask *task)

{
  MppPacket packet;
  void *p_00;
  size_t sVar1;
  MppWriteCtx *bits;
  MppWriteCtx bit_ctx;
  RK_S32 size;
  size_t buf_size;
  RK_U8 *ptr;
  MppPacket pkt;
  JpegeSyntax syntax;
  JpegeCtx *p;
  HalEncTask *task_local;
  void *ctx_local;
  
  syntax._176_8_ = ctx;
  memcpy(&pkt,(void *)((long)ctx + 8),0xb8);
  packet = task->packet;
  p_00 = mpp_packet_get_pos(packet);
  sVar1 = mpp_packet_get_size(packet);
  bit_ctx._44_4_ = 0;
  mpp_writer_init((MppWriteCtx *)&bits,p_00,(RK_S32)sVar1);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0xffd8,0x10);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0xffe0,0x10);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0x10,0x10);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0x4a46,0x10);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0x4946,0x10);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0,8);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0x102,0x10);
  if ((syntax.slice_size_mb_rows == 0) || (syntax.units_type == 0)) {
    mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0,8);
    mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0,8);
    mpp_writer_put_raw_bits((MppWriteCtx *)&bits,1,8);
    mpp_writer_put_raw_bits((MppWriteCtx *)&bits,1,0x10);
  }
  else {
    mpp_writer_put_raw_bits((MppWriteCtx *)&bits,syntax.slice_enable,8);
    mpp_writer_put_raw_bits((MppWriteCtx *)&bits,syntax.slice_size_mb_rows,0x10);
    mpp_writer_put_raw_bits((MppWriteCtx *)&bits,syntax.units_type,0x10);
  }
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0,8);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bits,0,8);
  bit_ctx._44_4_ = mpp_writer_bytes((MppWriteCtx *)&bits);
  mpp_packet_set_length(packet,(long)(int)bit_ctx._44_4_);
  task->length = bit_ctx._44_4_ + task->length;
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_start(void *ctx, HalEncTask *task)
{
    JpegeCtx *p = (JpegeCtx *)ctx;
    JpegeSyntax syntax = p->syntax;
    MppPacket pkt = task->packet;
    RK_U8 *ptr = mpp_packet_get_pos(pkt);
    size_t buf_size = mpp_packet_get_size(pkt);
    RK_S32 size = 0;
    MppWriteCtx bit_ctx;
    MppWriteCtx *bits = &bit_ctx;

    mpp_writer_init(bits, ptr, buf_size);

    /* add SOI and APP0 data */
    /* SOI */
    mpp_writer_put_raw_bits(bits, 0xFFD8, 16);
    /* APP0 */
    mpp_writer_put_raw_bits(bits, 0xFFE0, 16);
    /* length */
    mpp_writer_put_raw_bits(bits, 0x0010, 16);
    /* "JFIF" ID */
    /* Ident1 */
    mpp_writer_put_raw_bits(bits, 0x4A46, 16);
    /* Ident2 */
    mpp_writer_put_raw_bits(bits, 0x4946, 16);
    /* Ident3 */
    mpp_writer_put_raw_bits(bits, 0x00, 8);
    /* Version */
    mpp_writer_put_raw_bits(bits, 0x0102, 16);

    if (syntax.density_x && syntax.density_y) {
        /* Units */
        mpp_writer_put_raw_bits(bits, syntax.units_type, 8);
        /* Xdensity */
        mpp_writer_put_raw_bits(bits, syntax.density_x, 16);
        /* Ydensity */
        mpp_writer_put_raw_bits(bits, syntax.density_y, 16);
    } else {
        /* Units */
        mpp_writer_put_raw_bits(bits, 0, 8);
        /* Xdensity */
        mpp_writer_put_raw_bits(bits, 0, 8);
        mpp_writer_put_raw_bits(bits, 1, 8);
        /* Ydensity */
        mpp_writer_put_raw_bits(bits, 1, 16);
    }
    /* XThumbnail */
    mpp_writer_put_raw_bits(bits, 0x00, 8);
    /* YThumbnail */
    mpp_writer_put_raw_bits(bits, 0x00, 8);
    /* Do NOT write thumbnail */
    size = mpp_writer_bytes(bits);
    mpp_packet_set_length(pkt, size);
    task->length += size;

    return MPP_OK;
}